

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonFuncArgMightBeBinary(sqlite3_value *pJson)

{
  int iVar1;
  u32 uVar2;
  byte *pbVar3;
  undefined1 local_78 [8];
  JsonParse s;
  int nBlob;
  u8 *aBlob;
  u32 n;
  u32 sz;
  sqlite3_value *pJson_local;
  
  _n = pJson;
  iVar1 = sqlite3_value_type(pJson);
  if (iVar1 == 4) {
    pbVar3 = (byte *)sqlite3_value_blob(_n);
    s.aIns._4_4_ = sqlite3_value_bytes(_n);
    if (s.aIns._4_4_ < 1) {
      pJson_local._4_4_ = 0;
    }
    else if ((pbVar3 == (byte *)0x0) || (0xc < (*pbVar3 & 0xf))) {
      pJson_local._4_4_ = 0;
    }
    else {
      memset(local_78,0,0x48);
      s.aBlob._0_4_ = s.aIns._4_4_;
      local_78 = (undefined1  [8])pbVar3;
      uVar2 = jsonbPayloadSize((JsonParse *)local_78,0,(u32 *)((long)&aBlob + 4));
      if (uVar2 == 0) {
        pJson_local._4_4_ = 0;
      }
      else if (aBlob._4_4_ + uVar2 == s.aIns._4_4_) {
        if (((*pbVar3 & 0xf) < 3) && (aBlob._4_4_ != 0)) {
          pJson_local._4_4_ = 0;
        }
        else {
          pJson_local._4_4_ = (uint)(aBlob._4_4_ + uVar2 == s.aIns._4_4_);
        }
      }
      else {
        pJson_local._4_4_ = 0;
      }
    }
  }
  else {
    pJson_local._4_4_ = 0;
  }
  return pJson_local._4_4_;
}

Assistant:

static int jsonFuncArgMightBeBinary(sqlite3_value *pJson){
  u32 sz, n;
  const u8 *aBlob;
  int nBlob;
  JsonParse s;
  if( sqlite3_value_type(pJson)!=SQLITE_BLOB ) return 0;
  aBlob = sqlite3_value_blob(pJson);
  nBlob = sqlite3_value_bytes(pJson);
  if( nBlob<1 ) return 0;
  if( NEVER(aBlob==0) || (aBlob[0] & 0x0f)>JSONB_OBJECT ) return 0;
  memset(&s, 0, sizeof(s));
  s.aBlob = (u8*)aBlob;
  s.nBlob = nBlob;
  n = jsonbPayloadSize(&s, 0, &sz);
  if( n==0 ) return 0;
  if( sz+n!=(u32)nBlob ) return 0;
  if( (aBlob[0] & 0x0f)<=JSONB_FALSE && sz>0 ) return 0;
  return sz+n==(u32)nBlob;
}